

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPIRVShaderResources.cpp
# Opt level: O1

string * __thiscall
Diligent::SPIRVShaderResources::DumpResources_abi_cxx11_
          (string *__return_storage_ptr__,SPIRVShaderResources *this)

{
  char cVar1;
  string *psVar2;
  size_t sVar3;
  ostream *poVar4;
  SPIRVShaderResourceAttribs *pSVar5;
  long *plVar6;
  char (*Args_1) [30];
  Uint32 UVar7;
  Uint32 UVar8;
  Uint32 UVar9;
  char *pcVar10;
  Uint32 ResNum;
  string msg;
  anon_class_16_2_2bfcf79f DumpResource;
  stringstream ss;
  Uint32 local_1f4;
  string local_1f0;
  anon_class_16_2_2bfcf79f local_1d0;
  string *local_1c0;
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Shader \'",8);
  pcVar10 = this->m_ShaderName;
  if (pcVar10 == (char *)0x0) {
    std::ios::clear((int)(ostream *)local_1a8 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
  }
  else {
    sVar3 = strlen(pcVar10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar10,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\' resource stats: total resources: ",0x23);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"UBs: ",5);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"; SBs: ",7);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"; Imgs: ",8);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"; Smpl Imgs: ",0xd);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"; ACs: ",7);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"; Sep Imgs: ",0xc);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"; Sep Smpls: ",0xd);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  local_1f0._M_dataplus._M_p._0_1_ = 0x2e;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_1f0,1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Resources:",10);
  local_1d0.ResNum = &local_1f4;
  local_1f4 = 0;
  UVar7 = (Uint32)this->m_StorageBufferOffset;
  cVar1 = (char)(ostream *)local_1a8;
  local_1d0.ss = (stringstream *)local_1b8;
  local_1c0 = __return_storage_ptr__;
  if (this->m_StorageBufferOffset != 0) {
    UVar8 = 0;
    do {
      pSVar5 = GetResAttribs(this,UVar8,UVar7,0);
      if (pSVar5->Type != UniformBuffer) {
        FormatString<char[25]>(&local_1f0,(char (*) [25])"Unexpected resource type");
        DebugAssertionFailed
                  ((Char *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,
                                    local_1f0._M_dataplus._M_p._0_1_),"operator()",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
                   ,0x36c);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_) !=
            &local_1f0.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_
                                  ),local_1f0.field_2._M_allocated_capacity + 1);
        }
      }
      std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar1);
      std::ostream::put(cVar1);
      plVar6 = (long *)std::ostream::flush();
      *(undefined8 *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x10) = 3;
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)plVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," Uniform Buffer     ",0x14);
      DumpResources::anon_class_16_2_2bfcf79f::operator()(&local_1d0,pSVar5);
      UVar8 = UVar8 + 1;
      UVar7 = (Uint32)this->m_StorageBufferOffset;
    } while (UVar8 < UVar7);
  }
  UVar7 = (Uint32)this->m_StorageBufferOffset;
  UVar8 = (uint)this->m_StorageImageOffset - (uint)this->m_StorageBufferOffset;
  if (UVar8 != 0) {
    UVar9 = 0;
    do {
      pSVar5 = GetResAttribs(this,UVar9,UVar8,UVar7);
      if (1 < (byte)(pSVar5->Type - ROStorageBuffer)) {
        FormatString<char[25]>(&local_1f0,(char (*) [25])"Unexpected resource type");
        DebugAssertionFailed
                  ((Char *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,
                                    local_1f0._M_dataplus._M_p._0_1_),"operator()",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
                   ,0x375);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_) !=
            &local_1f0.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_
                                  ),local_1f0.field_2._M_allocated_capacity + 1);
        }
      }
      std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar1);
      std::ostream::put(cVar1);
      plVar6 = (long *)std::ostream::flush();
      *(undefined8 *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x10) = 3;
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)plVar6);
      pcVar10 = " RW Storage Buffer  ";
      if (pSVar5->Type == ROStorageBuffer) {
        pcVar10 = " RO Storage Buffer  ";
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar10,0x14);
      DumpResources::anon_class_16_2_2bfcf79f::operator()(&local_1d0,pSVar5);
      UVar9 = UVar9 + 1;
      UVar7 = (Uint32)this->m_StorageBufferOffset;
      UVar8 = this->m_StorageImageOffset - UVar7;
    } while (UVar9 < UVar8);
  }
  UVar7 = (Uint32)this->m_StorageImageOffset;
  UVar8 = (uint)this->m_SampledImageOffset - (uint)this->m_StorageImageOffset;
  if (UVar8 != 0) {
    UVar9 = 0;
    do {
      pSVar5 = GetResAttribs(this,UVar9,UVar8,UVar7);
      if (pSVar5->Type == StorageTexelBuffer) {
        std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar1);
        std::ostream::put(cVar1);
        plVar6 = (long *)std::ostream::flush();
        *(undefined8 *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x10) = 3;
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)plVar6);
        pcVar10 = " Storage Txl Buff ";
LAB_002a9d25:
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar10,0x12);
      }
      else {
        if (pSVar5->Type == StorageImage) {
          std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar1);
          std::ostream::put(cVar1);
          plVar6 = (long *)std::ostream::flush();
          *(undefined8 *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x10) = 3;
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)plVar6);
          pcVar10 = " Storage Image    ";
          goto LAB_002a9d25;
        }
        FormatString<char[25]>(&local_1f0,(char (*) [25])"Unexpected resource type");
        DebugAssertionFailed
                  ((Char *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,
                                    local_1f0._M_dataplus._M_p._0_1_),"operator()",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
                   ,0x388);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_) !=
            &local_1f0.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_
                                  ),local_1f0.field_2._M_allocated_capacity + 1);
        }
      }
      DumpResources::anon_class_16_2_2bfcf79f::operator()(&local_1d0,pSVar5);
      UVar9 = UVar9 + 1;
      UVar7 = (Uint32)this->m_StorageImageOffset;
      UVar8 = this->m_SampledImageOffset - UVar7;
    } while (UVar9 < UVar8);
  }
  UVar7 = (Uint32)this->m_SampledImageOffset;
  UVar8 = (uint)this->m_AtomicCounterOffset - (uint)this->m_SampledImageOffset;
  if (UVar8 != 0) {
    UVar9 = 0;
    do {
      pSVar5 = GetResAttribs(this,UVar9,UVar8,UVar7);
      if (pSVar5->Type == UniformTexelBuffer) {
        std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar1);
        std::ostream::put(cVar1);
        plVar6 = (long *)std::ostream::flush();
        *(undefined8 *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x10) = 3;
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)plVar6);
        pcVar10 = " Uniform Txl Buff ";
LAB_002a9e74:
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar10,0x12);
      }
      else {
        if (pSVar5->Type == SampledImage) {
          std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar1);
          std::ostream::put(cVar1);
          plVar6 = (long *)std::ostream::flush();
          *(undefined8 *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x10) = 3;
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)plVar6);
          pcVar10 = " Sampled Image    ";
          goto LAB_002a9e74;
        }
        FormatString<char[25]>(&local_1f0,(char (*) [25])"Unexpected resource type");
        DebugAssertionFailed
                  ((Char *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,
                                    local_1f0._M_dataplus._M_p._0_1_),"operator()",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
                   ,0x398);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_) !=
            &local_1f0.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_
                                  ),local_1f0.field_2._M_allocated_capacity + 1);
        }
      }
      DumpResources::anon_class_16_2_2bfcf79f::operator()(&local_1d0,pSVar5);
      UVar9 = UVar9 + 1;
      UVar7 = (Uint32)this->m_SampledImageOffset;
      UVar8 = this->m_AtomicCounterOffset - UVar7;
    } while (UVar9 < UVar8);
  }
  UVar7 = (Uint32)this->m_AtomicCounterOffset;
  UVar8 = (uint)this->m_SeparateSamplerOffset - (uint)this->m_AtomicCounterOffset;
  if (UVar8 != 0) {
    UVar9 = 0;
    do {
      pSVar5 = GetResAttribs(this,UVar9,UVar8,UVar7);
      if (pSVar5->Type != AtomicCounter) {
        FormatString<char[25]>(&local_1f0,(char (*) [25])"Unexpected resource type");
        DebugAssertionFailed
                  ((Char *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,
                                    local_1f0._M_dataplus._M_p._0_1_),"operator()",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
                   ,0x39d);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_) !=
            &local_1f0.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_
                                  ),local_1f0.field_2._M_allocated_capacity + 1);
        }
      }
      std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar1);
      std::ostream::put(cVar1);
      plVar6 = (long *)std::ostream::flush();
      *(undefined8 *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x10) = 3;
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)plVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," Atomic Cntr      ",0x12);
      DumpResources::anon_class_16_2_2bfcf79f::operator()(&local_1d0,pSVar5);
      UVar9 = UVar9 + 1;
      UVar7 = (Uint32)this->m_AtomicCounterOffset;
      UVar8 = this->m_SeparateSamplerOffset - UVar7;
    } while (UVar9 < UVar8);
  }
  UVar7 = (Uint32)this->m_SeparateSamplerOffset;
  UVar8 = (uint)this->m_SeparateImageOffset - (uint)this->m_SeparateSamplerOffset;
  if (UVar8 != 0) {
    UVar9 = 0;
    do {
      pSVar5 = GetResAttribs(this,UVar9,UVar8,UVar7);
      if (pSVar5->Type != SeparateSampler) {
        FormatString<char[25]>(&local_1f0,(char (*) [25])"Unexpected resource type");
        DebugAssertionFailed
                  ((Char *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,
                                    local_1f0._M_dataplus._M_p._0_1_),"operator()",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
                   ,0x3a4);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_) !=
            &local_1f0.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_
                                  ),local_1f0.field_2._M_allocated_capacity + 1);
        }
      }
      std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar1);
      std::ostream::put(cVar1);
      plVar6 = (long *)std::ostream::flush();
      *(undefined8 *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x10) = 3;
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)plVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," Separate Smpl    ",0x12);
      DumpResources::anon_class_16_2_2bfcf79f::operator()(&local_1d0,pSVar5);
      UVar9 = UVar9 + 1;
      UVar7 = (Uint32)this->m_SeparateSamplerOffset;
      UVar8 = this->m_SeparateImageOffset - UVar7;
    } while (UVar9 < UVar8);
  }
  UVar7 = (Uint32)this->m_SeparateImageOffset;
  UVar8 = (uint)this->m_InputAttachmentOffset - (uint)this->m_SeparateImageOffset;
  if (UVar8 != 0) {
    UVar9 = 0;
    do {
      pSVar5 = GetResAttribs(this,UVar9,UVar8,UVar7);
      if (pSVar5->Type != SeparateImage) {
        FormatString<char[25]>(&local_1f0,(char (*) [25])"Unexpected resource type");
        DebugAssertionFailed
                  ((Char *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,
                                    local_1f0._M_dataplus._M_p._0_1_),"operator()",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
                   ,0x3ab);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_) !=
            &local_1f0.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_
                                  ),local_1f0.field_2._M_allocated_capacity + 1);
        }
      }
      std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar1);
      std::ostream::put(cVar1);
      plVar6 = (long *)std::ostream::flush();
      *(undefined8 *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x10) = 3;
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)plVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," Separate Img     ",0x12);
      DumpResources::anon_class_16_2_2bfcf79f::operator()(&local_1d0,pSVar5);
      UVar9 = UVar9 + 1;
      UVar7 = (Uint32)this->m_SeparateImageOffset;
      UVar8 = this->m_InputAttachmentOffset - UVar7;
    } while (UVar9 < UVar8);
  }
  UVar7 = (Uint32)this->m_InputAttachmentOffset;
  UVar8 = (uint)this->m_AccelStructOffset - (uint)this->m_InputAttachmentOffset;
  if (UVar8 != 0) {
    UVar9 = 0;
    do {
      pSVar5 = GetResAttribs(this,UVar9,UVar8,UVar7);
      if (pSVar5->Type != InputAttachment) {
        FormatString<char[25]>(&local_1f0,(char (*) [25])"Unexpected resource type");
        DebugAssertionFailed
                  ((Char *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,
                                    local_1f0._M_dataplus._M_p._0_1_),"operator()",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
                   ,0x3b2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_) !=
            &local_1f0.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_
                                  ),local_1f0.field_2._M_allocated_capacity + 1);
        }
      }
      std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar1);
      std::ostream::put(cVar1);
      plVar6 = (long *)std::ostream::flush();
      *(undefined8 *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x10) = 3;
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)plVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," Input Attachment ",0x12);
      DumpResources::anon_class_16_2_2bfcf79f::operator()(&local_1d0,pSVar5);
      UVar9 = UVar9 + 1;
      UVar7 = (Uint32)this->m_InputAttachmentOffset;
      UVar8 = this->m_AccelStructOffset - UVar7;
    } while (UVar9 < UVar8);
  }
  Args_1 = (char (*) [30])(ulong)this->m_AccelStructOffset;
  UVar7 = (uint)this->m_TotalResources - (uint)this->m_AccelStructOffset;
  if (UVar7 != 0) {
    UVar8 = 0;
    do {
      pSVar5 = GetResAttribs(this,UVar8,UVar7,(Uint32)Args_1);
      if (pSVar5->Type != AccelerationStructure) {
        FormatString<char[25]>(&local_1f0,(char (*) [25])"Unexpected resource type");
        DebugAssertionFailed
                  ((Char *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,
                                    local_1f0._M_dataplus._M_p._0_1_),"operator()",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
                   ,0x3b9);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_) !=
            &local_1f0.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_
                                  ),local_1f0.field_2._M_allocated_capacity + 1);
        }
      }
      std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar1);
      std::ostream::put(cVar1);
      plVar6 = (long *)std::ostream::flush();
      *(undefined8 *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x10) = 3;
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)plVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," Accel Struct     ",0x12);
      DumpResources::anon_class_16_2_2bfcf79f::operator()(&local_1d0,pSVar5);
      UVar8 = UVar8 + 1;
      Args_1 = (char (*) [30])(ulong)this->m_AccelStructOffset;
      UVar7 = (uint)this->m_TotalResources - (uint)this->m_AccelStructOffset;
    } while (UVar8 < UVar7);
  }
  psVar2 = local_1c0;
  if (local_1f4 != this->m_TotalResources) {
    FormatString<char[26],char[30]>
              (&local_1f0,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"ResNum == GetTotalResources()",Args_1);
    DebugAssertionFailed
              ((Char *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_),
               "DumpResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
               ,0x3bf);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_) !=
        &local_1f0.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_),
                      local_1f0.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar2;
}

Assistant:

std::string SPIRVShaderResources::DumpResources() const
{
    std::stringstream ss;
    ss << "Shader '" << m_ShaderName << "' resource stats: total resources: " << GetTotalResources() << ":" << std::endl
       << "UBs: " << GetNumUBs() << "; SBs: " << GetNumSBs() << "; Imgs: " << GetNumImgs() << "; Smpl Imgs: " << GetNumSmpldImgs()
       << "; ACs: " << GetNumACs() << "; Sep Imgs: " << GetNumSepImgs() << "; Sep Smpls: " << GetNumSepSmplrs() << '.' << std::endl
       << "Resources:";

    Uint32 ResNum       = 0;
    auto   DumpResource = [&ss, &ResNum](const SPIRVShaderResourceAttribs& Res) {
        std::stringstream FullResNameSS;
        FullResNameSS << '\'' << Res.Name;
        if (Res.ArraySize > 1)
            FullResNameSS << '[' << Res.ArraySize << ']';
        FullResNameSS << '\'';
        ss << std::setw(32) << FullResNameSS.str();
        ++ResNum;
    };

    ProcessResources(
        [&](const SPIRVShaderResourceAttribs& UB, Uint32) //
        {
            VERIFY(UB.Type == SPIRVShaderResourceAttribs::ResourceType::UniformBuffer, "Unexpected resource type");
            ss << std::endl
               << std::setw(3) << ResNum << " Uniform Buffer     ";
            DumpResource(UB);
        },
        [&](const SPIRVShaderResourceAttribs& SB, Uint32) //
        {
            VERIFY(SB.Type == SPIRVShaderResourceAttribs::ResourceType::ROStorageBuffer ||
                       SB.Type == SPIRVShaderResourceAttribs::ResourceType::RWStorageBuffer,
                   "Unexpected resource type");
            ss << std::endl
               << std::setw(3) << ResNum
               << (SB.Type == SPIRVShaderResourceAttribs::ResourceType::ROStorageBuffer ? " RO Storage Buffer  " : " RW Storage Buffer  ");
            DumpResource(SB);
        },
        [&](const SPIRVShaderResourceAttribs& Img, Uint32) //
        {
            if (Img.Type == SPIRVShaderResourceAttribs::ResourceType::StorageImage)
            {
                ss << std::endl
                   << std::setw(3) << ResNum << " Storage Image    ";
            }
            else if (Img.Type == SPIRVShaderResourceAttribs::ResourceType::StorageTexelBuffer)
            {
                ss << std::endl
                   << std::setw(3) << ResNum << " Storage Txl Buff ";
            }
            else
                UNEXPECTED("Unexpected resource type");
            DumpResource(Img);
        },
        [&](const SPIRVShaderResourceAttribs& SmplImg, Uint32) //
        {
            if (SmplImg.Type == SPIRVShaderResourceAttribs::ResourceType::SampledImage)
            {
                ss << std::endl
                   << std::setw(3) << ResNum << " Sampled Image    ";
            }
            else if (SmplImg.Type == SPIRVShaderResourceAttribs::ResourceType::UniformTexelBuffer)
            {
                ss << std::endl
                   << std::setw(3) << ResNum << " Uniform Txl Buff ";
            }
            else
                UNEXPECTED("Unexpected resource type");
            DumpResource(SmplImg);
        },
        [&](const SPIRVShaderResourceAttribs& AC, Uint32) //
        {
            VERIFY(AC.Type == SPIRVShaderResourceAttribs::ResourceType::AtomicCounter, "Unexpected resource type");
            ss << std::endl
               << std::setw(3) << ResNum << " Atomic Cntr      ";
            DumpResource(AC);
        },
        [&](const SPIRVShaderResourceAttribs& SepSmpl, Uint32) //
        {
            VERIFY(SepSmpl.Type == SPIRVShaderResourceAttribs::ResourceType::SeparateSampler, "Unexpected resource type");
            ss << std::endl
               << std::setw(3) << ResNum << " Separate Smpl    ";
            DumpResource(SepSmpl);
        },
        [&](const SPIRVShaderResourceAttribs& SepImg, Uint32) //
        {
            VERIFY(SepImg.Type == SPIRVShaderResourceAttribs::ResourceType::SeparateImage, "Unexpected resource type");
            ss << std::endl
               << std::setw(3) << ResNum << " Separate Img     ";
            DumpResource(SepImg);
        },
        [&](const SPIRVShaderResourceAttribs& InptAtt, Uint32) //
        {
            VERIFY(InptAtt.Type == SPIRVShaderResourceAttribs::ResourceType::InputAttachment, "Unexpected resource type");
            ss << std::endl
               << std::setw(3) << ResNum << " Input Attachment ";
            DumpResource(InptAtt);
        },
        [&](const SPIRVShaderResourceAttribs& AccelStruct, Uint32) //
        {
            VERIFY(AccelStruct.Type == SPIRVShaderResourceAttribs::ResourceType::AccelerationStructure, "Unexpected resource type");
            ss << std::endl
               << std::setw(3) << ResNum << " Accel Struct     ";
            DumpResource(AccelStruct);
        } //
    );
    VERIFY_EXPR(ResNum == GetTotalResources());

    return ss.str();
}